

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ExtensionSet::SetEnum
          (ExtensionSet *this,int number,FieldType type,int value,FieldDescriptor *descriptor)

{
  Extension *pEVar1;
  Nonnull<const_char_*> pcVar2;
  ExtensionSet *this_00;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar1->is_repeated != false) goto LAB_0040592d;
    pcVar2 = (Nonnull<const_char_*>)0x0;
LAB_004058de:
    if (pcVar2 == (Nonnull<const_char_*>)0x0) {
      if (0xed < (byte)(pEVar1->type - 0x13)) {
        if ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) == 8)
        {
          pcVar2 = (Nonnull<const_char_*>)0x0;
        }
        else {
          pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                             ((ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap +
                                              (ulong)pEVar1->type * 4),8,
                              "cpp_type((*extension).type) == WireFormatLite::CPPTYPE_ENUM");
        }
        if (pcVar2 != (Nonnull<const_char_*>)0x0) goto LAB_0040598f;
        goto LAB_0040590f;
      }
      this_00 = (ExtensionSet *)&stack0xffffffffffffffd0;
      SetEnum(this_00);
LAB_0040594c:
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         ((long)this_00,8,
                          "cpp_type(extension->type) == WireFormatLite::CPPTYPE_ENUM");
      goto LAB_004058c0;
    }
    SetEnum();
  }
  else {
    pEVar1->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      SetEnum((ExtensionSet *)&stack0xffffffffffffffd0);
LAB_0040592d:
      pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                         (0,1,
                          "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                         );
      goto LAB_004058de;
    }
    this_00 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4);
    if (this_00 != (ExtensionSet *)&DAT_00000008) goto LAB_0040594c;
    pcVar2 = (Nonnull<const_char_*>)0x0;
LAB_004058c0:
    if (pcVar2 == (Nonnull<const_char_*>)0x0) {
      pEVar1->is_repeated = false;
      pEVar1->field_0xa = pEVar1->field_0xa & 0xfe;
LAB_0040590f:
      pEVar1->field_0xa = pEVar1->field_0xa & 0xfd;
      (pEVar1->field_0).enum_value = value;
      return;
    }
  }
  SetEnum();
LAB_0040598f:
  SetEnum();
}

Assistant:

void ExtensionSet::SetEnum(int number, FieldType type, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = false;
    extension->is_pointer = false;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
  }
  extension->is_cleared = false;
  extension->enum_value = value;
}